

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CoverageBinsArraySizeSyntax *pCVar1;
  DeepCloneVisitor visitor;
  Token local_40;
  Token local_30;
  SyntaxNode *local_20;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x28) == (SyntaxNode *)0x0) {
    local_20 = (SyntaxNode *)0x0;
  }
  else {
    local_20 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverageBinsArraySizeSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,(ExpressionSyntax **)&local_20,
                      &local_30);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverageBinsArraySizeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverageBinsArraySizeSyntax>(
        node.openBracket.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeBracket.deepClone(alloc)
    );
}